

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O1

void Min_CubeWrite(FILE *pFile,Min_Cube_t *pCube)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  int __c;
  uint uVar6;
  bool bVar7;
  
  uVar1 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar5 = 0;
    uVar2 = 0;
    do {
      uVar6 = 0xfffffffe;
      do {
        uVar6 = uVar6 + 2;
        uVar2 = uVar2 + (((pCube->uData[uVar5] >> 1 ^ pCube->uData[uVar5]) >> (uVar6 & 0x1f) & 1) !=
                        0);
      } while (uVar6 < 0x1e);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  if (*(uint *)&pCube->field_0x8 >> 0x16 != uVar2) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinUtil.c"
                  ,0x6d,"void Min_CubeWrite(FILE *, Min_Cube_t *)");
  }
  if ((*(ushort *)&pCube->field_0x8 & 0x3ff) != 0) {
    bVar4 = 0;
    uVar1 = 0;
    do {
      bVar7 = (pCube->uData[uVar1 >> 4] >> (bVar4 & 0x1e) & 2) == 0;
      iVar3 = 0x31;
      if (bVar7) {
        iVar3 = 0x3f;
      }
      __c = (uint)bVar7 * 3 + 0x2d;
      if ((pCube->uData[uVar1 >> 4] >> (bVar4 & 0x1e) & 1) == 0) {
        __c = iVar3;
      }
      fputc(__c,(FILE *)pFile);
      uVar1 = uVar1 + 1;
      bVar4 = bVar4 + 2;
    } while (uVar1 < (*(uint *)&pCube->field_0x8 & 0x3ff));
  }
  fwrite(" 1\n",3,1,(FILE *)pFile);
  return;
}

Assistant:

void Min_CubeWrite( FILE * pFile, Min_Cube_t * pCube )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "-" );
            else
                fprintf( pFile, "0" );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
                fprintf( pFile, "1" );
            else
                fprintf( pFile, "?" );
        }
    fprintf( pFile, " 1\n" );
//    fprintf( pFile, " %d\n", pCube->nLits );
}